

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall coins_tests::ccoins_serialization::test_method(ccoins_serialization *this)

{
  long lVar1;
  size_type sVar2;
  CScript *pCVar3;
  ulong uVar4;
  uint uVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  Coin *pCVar7;
  DataStream *pDVar8;
  iterator pvVar9;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> s_00;
  Span<const_std::byte> sp_00;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> s_02;
  Span<const_std::byte> sp_01;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  Span<const_std::byte> sp_02;
  const_string file_11;
  const_string file_12;
  Span<const_unsigned_char> s_03;
  Span<const_std::byte> sp_03;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  check_type cVar10;
  char *local_4e8;
  char *local_4e0;
  assertion_result local_4d8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  uint64_t x;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  DataStream ss1;
  lazy_ostream local_1d8;
  undefined1 *local_1c8;
  char *local_1c0;
  DataStream ss5;
  Coin cc4;
  undefined1 local_168 [24];
  undefined8 uStack_150;
  DataStream ss4;
  Coin cc2;
  Coin cc3;
  DataStream ss3;
  DataStream ss2;
  Coin cc1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ = 0xa5cf;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] = '\x7f';
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] = ')';
  cc3.out.scriptPubKey.super_CScriptBase._union._12_4_ = 0x7cf86bb3;
  cc3.out.scriptPubKey.super_CScriptBase._union._16_2_ = 0x351d;
  cc3.out.nValue = 0x61810058833cf297;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\x15';
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[1] = -0x6c;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[2] = 'N';
  cc3.out.scriptPubKey.super_CScriptBase._union._3_5_ = 0x3c8e77f07;
  sp.m_size = 0x1a;
  sp.m_data = (byte *)&cc3;
  DataStream::DataStream(&ss1,sp);
  Coin::Coin(&cc1);
  Coin::Unserialize<DataStream>(&cc1,&ss1);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x207;
  file.m_begin = (iterator)&local_208;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_218,msg);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc3.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ = 0xc140;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] = '\x15';
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] = '\x01';
  cc3.out.scriptPubKey.super_CScriptBase._union._12_4_ = 0;
  cc3.out.scriptPubKey.super_CScriptBase._union._16_2_ = 0xf1cc;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0x12] = -0x39;
  cc3.out.scriptPubKey.super_CScriptBase._union._19_5_ = 0;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_220 = "";
  pCVar7 = &cc2;
  cc2.out.nValue = CONCAT44(cc2.out.nValue._4_4_,cc1._40_4_) & 0xffffffff00000001;
  cc4.out.nValue = cc4.out.nValue & 0xffffffffffffff00;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,bool>
            (&cc3,&local_228,0x207,1,2,pCVar7,"cc1.fCoinBase",&cc4,"false");
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x208;
  file_00.m_begin = (iterator)&local_238;
  msg_00.m_end = (iterator)pCVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
             msg_00);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc3.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ = 0xc140;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] = '\x15';
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] = '\x01';
  cc3.out.scriptPubKey.super_CScriptBase._union._12_4_ = 0;
  cc3.out.scriptPubKey.super_CScriptBase._union._16_2_ = 0xf1cc;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0x12] = -0x39;
  cc3.out.scriptPubKey.super_CScriptBase._union._19_5_ = 0;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_250 = "";
  cc2.out.nValue = CONCAT44(cc2.out.nValue._4_4_,(uint)cc1._40_4_ >> 1);
  cc4.out.nValue = CONCAT44(cc4.out.nValue._4_4_,0x31cde);
  pvVar6 = (iterator)0x2;
  pCVar7 = &cc2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&cc3,&local_258,0x208,1,2,&cc2,"cc1.nHeight",&cc4,"203998U");
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x209;
  file_01.m_begin = (iterator)&local_268;
  msg_01.m_end = (iterator)pCVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_278,
             msg_01);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc3.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ = 0xc140;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] = '\x15';
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] = '\x01';
  cc3.out.scriptPubKey.super_CScriptBase._union._12_4_ = 0;
  cc3.out.scriptPubKey.super_CScriptBase._union._16_2_ = 0xf1cc;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0x12] = -0x39;
  cc3.out.scriptPubKey.super_CScriptBase._union._19_5_ = 0;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_280 = "";
  cc2.out.nValue = 60000000000;
  pvVar6 = (iterator)0x2;
  pCVar7 = &cc1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&cc3,&local_288,0x209,1,2,pCVar7,"cc1.out.nValue",&cc2,"CAmount{60000000000}");
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x20a;
  file_02.m_begin = (iterator)&local_298;
  msg_02.m_end = (iterator)pCVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
             msg_02);
  cc2.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc2.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc2.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  cc2.out.scriptPubKey.super_CScriptBase._union._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_2b0 = "";
  sVar2 = cc1.out.scriptPubKey.super_CScriptBase._size - 0x1d;
  if (cc1.out.scriptPubKey.super_CScriptBase._size < 0x1d) {
    sVar2 = cc1.out.scriptPubKey.super_CScriptBase._size;
    cc1.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
         (char *)&cc1.out.scriptPubKey;
  }
  s.m_size._0_4_ = sVar2;
  s.m_data = (uchar *)cc1.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
  s.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)&cc4,s);
  local_168._0_8_ = 0xe77f074e94156181;
  local_168._8_8_ = 0x6bb3297fa5cf03c8;
  local_168._16_4_ = 0x351d7cf8;
  vch.m_size = 0x14;
  vch.m_data = local_168;
  base_blob<160U>::base_blob((base_blob<160U> *)&ss4,vch);
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ =
       (undefined2)
       ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] =
       (char)((uint)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ >> 0x10);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] =
       (char)((uint)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ >> 0x18);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] =
       (char)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[1] =
       (char)((ulong)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_finish >> 8);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[2] =
       (char)((ulong)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_finish >> 0x10);
  cc3.out.scriptPubKey.super_CScriptBase._union._3_5_ =
       (undefined5)
       ((ulong)ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x18);
  GetScriptForDestination((CScript *)&ss3,(CTxDestination *)&cc3);
  uVar5 = ss3.m_read_pos._4_4_ - 0x1d;
  pDVar8 = (DataStream *)
           CONCAT44(ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                    ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start._0_4_);
  if (ss3.m_read_pos._4_4_ < 0x1d) {
    uVar5 = ss3.m_read_pos._4_4_;
    pDVar8 = &ss3;
  }
  s_00.m_size._0_4_ = uVar5;
  s_00.m_data = (uchar *)pDVar8;
  s_00.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)&ss2,s_00);
  pvVar6 = (iterator)0x2;
  pCVar7 = &cc4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&cc2,&local_2b8,0x20a,1,2,pCVar7,"HexStr(cc1.out.scriptPubKey)",(string *)&ss2,
             "HexStr(GetScriptForDestination(PKHash(uint160(\"816115944e077fe7c803cfa57f29b36bf87c1d35\"_hex_u8))))"
            );
  std::__cxx11::string::~string((string *)&ss2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ss3);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&cc3);
  std::__cxx11::string::~string((string *)&cc4);
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ = 0x500f;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] = -0x56;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] = -0x39;
  cc3.out.scriptPubKey.super_CScriptBase._union._12_4_ = 0x957f7ef1;
  cc3.out.scriptPubKey.super_CScriptBase._union._16_2_ = 0xca55;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0x12] = -0x5c;
  cc3.out.nValue = 0x8c0023d1bb77df8d;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] = -0x68;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[1] = -0x71;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[2] = '\x1a';
  cc3.out.scriptPubKey.super_CScriptBase._union._3_5_ = 0x1e16e24d4a;
  sp_00.m_size = 0x1b;
  sp_00.m_data = (byte *)&cc3;
  DataStream::DataStream(&ss2,sp_00);
  Coin::Coin(&cc2);
  Coin::Unserialize<DataStream>(&cc2,&ss2);
  local_2c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x210;
  file_03.m_begin = (iterator)&local_2c8;
  msg_03.m_end = (iterator)pCVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
             msg_03);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc3.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ = 0xc140;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] = '\x15';
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] = '\x01';
  cc3.out.scriptPubKey.super_CScriptBase._union._12_4_ = 0;
  cc3.out.scriptPubKey.super_CScriptBase._union._16_2_ = 0xf1cc;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0x12] = -0x39;
  cc3.out.scriptPubKey.super_CScriptBase._union._19_5_ = 0;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_2e0 = "";
  pCVar7 = &cc4;
  cc4.out.nValue = CONCAT44(cc4.out.nValue._4_4_,cc2._40_4_) & 0xffffffff00000001;
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,bool>
            (&cc3,&local_2e8,0x210,1,2,pCVar7,"cc2.fCoinBase",
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ss3,"true");
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x211;
  file_04.m_begin = (iterator)&local_2f8;
  msg_04.m_end = (iterator)pCVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_308,
             msg_04);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc3.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ = 0xc140;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] = '\x15';
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] = '\x01';
  cc3.out.scriptPubKey.super_CScriptBase._union._12_4_ = 0;
  cc3.out.scriptPubKey.super_CScriptBase._union._16_2_ = 0xf1cc;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0x12] = -0x39;
  cc3.out.scriptPubKey.super_CScriptBase._union._19_5_ = 0;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_310 = "";
  cc4.out.nValue = CONCAT44(cc4.out.nValue._4_4_,(uint)cc2._40_4_ >> 1);
  ss3.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x1d83b;
  pvVar6 = (iterator)0x2;
  pCVar7 = &cc4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&cc3,&local_318,0x211,1,2,&cc4,"cc2.nHeight",
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ss3,"120891U");
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x212;
  file_05.m_begin = (iterator)&local_328;
  msg_05.m_end = (iterator)pCVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
             msg_05);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc3.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ = 0xc140;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] = '\x15';
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] = '\x01';
  cc3.out.scriptPubKey.super_CScriptBase._union._12_4_ = 0;
  cc3.out.scriptPubKey.super_CScriptBase._union._16_2_ = 0xf1cc;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0x12] = -0x39;
  cc3.out.scriptPubKey.super_CScriptBase._union._19_5_ = 0;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_340 = "";
  cc4.out.nValue = CONCAT44(cc4.out.nValue._4_4_,0x1af3d);
  pvVar6 = (iterator)0x2;
  pCVar7 = &cc2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&cc3,&local_348,0x212,1,2,pCVar7,"cc2.out.nValue",&cc4,"110397");
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x213;
  file_06.m_begin = (iterator)&local_358;
  msg_06.m_end = (iterator)pCVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_368,
             msg_06);
  cc4.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc4.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc4.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  cc4.out.scriptPubKey.super_CScriptBase._union._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_370 = "";
  sVar2 = cc2.out.scriptPubKey.super_CScriptBase._size - 0x1d;
  pCVar3 = (CScript *)
           CONCAT71(cc2.out.scriptPubKey.super_CScriptBase._union._1_7_,
                    cc2.out.scriptPubKey.super_CScriptBase._union.direct[0]);
  if (cc2.out.scriptPubKey.super_CScriptBase._size < 0x1d) {
    sVar2 = cc2.out.scriptPubKey.super_CScriptBase._size;
    pCVar3 = &cc2.out.scriptPubKey;
  }
  s_01.m_size._0_4_ = sVar2;
  s_01.m_data = (uchar *)pCVar3;
  s_01.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)&ss3,s_01);
  local_1d8._vptr_lazy_ostream = (_func_int **)0x16e24d4a1a8f988c;
  local_1d8._8_8_ = 0x7f7ef1c7aa500f1e;
  local_1c8 = (undefined1 *)CONCAT44(local_1c8._4_4_,0xa4ca5595);
  vch_00.m_size = 0x14;
  vch_00.m_data = (uchar *)&local_1d8;
  base_blob<160U>::base_blob((base_blob<160U> *)&ss5,vch_00);
  cc3.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity._0_2_ =
       (undefined2)
       ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[10] =
       (char)((uint)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ >> 0x10);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0xb] =
       (char)((uint)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ >> 0x18);
  cc3.out.nValue =
       (ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start._1_7_ << 8;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[0] =
       (char)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish;
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[1] =
       (char)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_finish >> 8);
  cc3.out.scriptPubKey.super_CScriptBase._union.direct[2] =
       (char)((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_finish >> 0x10);
  cc3.out.scriptPubKey.super_CScriptBase._union._3_5_ =
       (undefined5)
       ((ulong)ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish >> 0x18);
  GetScriptForDestination((CScript *)local_168,(CTxDestination *)&cc3);
  uVar5 = uStack_150._4_4_ - 0x1d;
  pCVar3 = (CScript *)local_168._0_8_;
  if (uStack_150._4_4_ < 0x1d) {
    uVar5 = uStack_150._4_4_;
    pCVar3 = (CScript *)local_168;
  }
  s_02.m_size._0_4_ = uVar5;
  s_02.m_data = (uchar *)pCVar3;
  s_02.m_size._4_4_ = 0;
  HexStr_abi_cxx11_((string *)&ss4,s_02);
  pvVar6 = (iterator)0x2;
  pDVar8 = &ss3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&cc4,&local_378,0x213,1,2,pDVar8,"HexStr(cc2.out.scriptPubKey)",(string *)&ss4,
             "HexStr(GetScriptForDestination(PKHash(uint160(\"8c988f1a4a4de2161e0f50aac7f17e7f9555caa4\"_hex_u8))))"
            );
  std::__cxx11::string::~string((string *)&ss4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&cc3);
  std::__cxx11::string::~string((string *)&ss3);
  cc3.out.nValue = CONCAT53(cc3.out.nValue._3_5_,0x60000);
  sp_01.m_size = 3;
  sp_01.m_data = (byte *)&cc3;
  DataStream::DataStream(&ss3,sp_01);
  Coin::Coin(&cc3);
  Coin::Unserialize<DataStream>(&cc3,&ss3);
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x219;
  file_07.m_begin = (iterator)&local_388;
  msg_07.m_end = (iterator)pDVar8;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_398,
             msg_07);
  cc4.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc4.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc4.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  cc4.out.scriptPubKey.super_CScriptBase._union._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_3a0 = "";
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = cc3._40_4_ & 1;
  pDVar8 = &ss4;
  local_168._0_8_ = local_168._0_8_ & 0xffffffffffffff00;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,bool>
            (&cc4,&local_3a8,0x219,1,2,pDVar8,"cc3.fCoinBase",
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,"false");
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x21a;
  file_08.m_begin = (iterator)&local_3b8;
  msg_08.m_end = (iterator)pDVar8;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3c8,
             msg_08);
  cc4.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc4.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc4.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  cc4.out.scriptPubKey.super_CScriptBase._union._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_3d0 = "";
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = (uint)cc3._40_4_ >> 1;
  local_168._0_8_ = local_168._0_8_ & 0xffffffff00000000;
  pvVar6 = (iterator)0x2;
  pDVar8 = &ss4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&cc4,&local_3d8,0x21a,1,2,&ss4,"cc3.nHeight",
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,"0U");
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x21b;
  file_09.m_begin = (iterator)&local_3e8;
  msg_09.m_end = (iterator)pDVar8;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3f8,
             msg_09);
  cc4.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc4.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc4.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  cc4.out.scriptPubKey.super_CScriptBase._union._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_400 = "";
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  pvVar6 = (iterator)0x2;
  pCVar7 = &cc3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&cc4,&local_408,0x21b,1,2,pCVar7,"cc3.out.nValue",&ss4,"0");
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x21c;
  file_10.m_begin = (iterator)&local_418;
  msg_10.m_end = (iterator)pCVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_428,
             msg_10);
  cc4.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc4.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc4.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  cc4.out.scriptPubKey.super_CScriptBase._union._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_430 = "";
  ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = cc3.out.scriptPubKey.super_CScriptBase._size - 0x1d;
  if (cc3.out.scriptPubKey.super_CScriptBase._size < 0x1d) {
    ss4.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = cc3.out.scriptPubKey.super_CScriptBase._size;
  }
  pDVar8 = &ss4;
  local_168._0_8_ = local_168._0_8_ & 0xffffffff00000000;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&cc4,&local_438,0x21c,1,2,pDVar8,"cc3.out.scriptPubKey.size()",
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168,"0U");
  cc4.out.nValue = CONCAT53(cc4.out.nValue._3_5_,0x70000);
  sp_02.m_size = 3;
  sp_02.m_data = (byte *)&cc4;
  DataStream::DataStream(&ss4,sp_02);
  Coin::Coin(&cc4);
  Coin::Unserialize<DataStream>(&cc4,&ss4);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x2afbb3;
  file_11.m_end = (iterator)0x223;
  file_11.m_begin = (iterator)&local_448;
  msg_11.m_end = (iterator)pDVar8;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_458,
             msg_11);
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168._8_8_ = local_168._8_8_ & 0xffffffffffffff00;
  local_168._0_8_ = &PTR__lazy_ostream_011496b0;
  local_168._16_8_ = boost::unit_test::lazy_ostream::inst;
  uStack_150 = "We should have thrown";
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_460 = "";
  pvVar6 = &DAT_00000001;
  pvVar9 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&ss5,(lazy_ostream *)local_168,1,1,WARN,_cVar10,(size_t)&local_468,
             0x223);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &ss5.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&cc4.out.scriptPubKey.super_CScriptBase);
  local_168._16_8_ = 0;
  uStack_150 = (char *)0x0;
  local_168._0_8_ = (char *)0x0;
  local_168._8_8_ = 0;
  cc4.out.nValue = (CAmount)&x;
  x = 3000000000;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&>::Serialize<DataStream>
            ((Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)&cc4,
             (DataStream *)local_168);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x22b;
  file_12.m_begin = (iterator)&local_480;
  msg_12.m_end = pvVar9;
  msg_12.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_490,
             msg_12);
  cc4.out.scriptPubKey.super_CScriptBase._union.direct[0] = '\0';
  cc4.out.nValue = (CAmount)&PTR__lazy_ostream_011480b0;
  cc4.out.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
  cc4.out.scriptPubKey.super_CScriptBase._union._16_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_498 = "";
  s_03.m_data = (uchar *)(local_168._0_8_ + (long)uStack_150);
  s_03.m_size = local_168._8_8_ - (long)s_03.m_data;
  HexStr_abi_cxx11_((string *)&ss5,s_03);
  pvVar6 = (iterator)0x2;
  pDVar8 = &ss5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
            (&cc4,&local_4a0,0x22b,1,2,pDVar8,"HexStr(tmp)","8a95c0bb00","\"8a95c0bb00\"");
  std::__cxx11::string::~string((string *)&ss5);
  uVar4 = (ulong)cc4.out.nValue >> 0x30;
  cc4.out.nValue = CONCAT26((ushort)uVar4 & 0xff00,0xbbc000000000);
  cc4.out.nValue = CONCAT44(cc4.out.nValue._4_4_,0x958a0000);
  sp_03.m_size = 7;
  sp_03.m_data = (byte *)&cc4;
  DataStream::DataStream(&ss5,sp_03);
  Coin::Coin(&cc4);
  Coin::Unserialize<DataStream>(&cc4,&ss5);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x2afdbc;
  file_13.m_end = (iterator)0x230;
  file_13.m_begin = (iterator)&local_4b0;
  msg_13.m_end = (iterator)pDVar8;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4c0,
             msg_13);
  local_4d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_4d8.m_message.px = (element_type *)0x0;
  local_4d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011496b0;
  local_1c8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = "We should have thrown";
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_4e0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_4d8,&local_1d8,1,1,WARN,_cVar10,(size_t)&local_4e8,0x230);
  boost::detail::shared_count::~shared_count(&local_4d8.m_message.pn);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&cc4.out.scriptPubKey.super_CScriptBase);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss5);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_168);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss4);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&cc3.out.scriptPubKey.super_CScriptBase);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss3);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&cc2.out.scriptPubKey.super_CScriptBase);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&cc1.out.scriptPubKey.super_CScriptBase);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_serialization)
{
    // Good example
    DataStream ss1{"97f23c835800816115944e077fe7c803cfa57f29b36bf87c1d35"_hex};
    Coin cc1;
    ss1 >> cc1;
    BOOST_CHECK_EQUAL(cc1.fCoinBase, false);
    BOOST_CHECK_EQUAL(cc1.nHeight, 203998U);
    BOOST_CHECK_EQUAL(cc1.out.nValue, CAmount{60000000000});
    BOOST_CHECK_EQUAL(HexStr(cc1.out.scriptPubKey), HexStr(GetScriptForDestination(PKHash(uint160("816115944e077fe7c803cfa57f29b36bf87c1d35"_hex_u8)))));

    // Good example
    DataStream ss2{"8ddf77bbd123008c988f1a4a4de2161e0f50aac7f17e7f9555caa4"_hex};
    Coin cc2;
    ss2 >> cc2;
    BOOST_CHECK_EQUAL(cc2.fCoinBase, true);
    BOOST_CHECK_EQUAL(cc2.nHeight, 120891U);
    BOOST_CHECK_EQUAL(cc2.out.nValue, 110397);
    BOOST_CHECK_EQUAL(HexStr(cc2.out.scriptPubKey), HexStr(GetScriptForDestination(PKHash(uint160("8c988f1a4a4de2161e0f50aac7f17e7f9555caa4"_hex_u8)))));

    // Smallest possible example
    DataStream ss3{"000006"_hex};
    Coin cc3;
    ss3 >> cc3;
    BOOST_CHECK_EQUAL(cc3.fCoinBase, false);
    BOOST_CHECK_EQUAL(cc3.nHeight, 0U);
    BOOST_CHECK_EQUAL(cc3.out.nValue, 0);
    BOOST_CHECK_EQUAL(cc3.out.scriptPubKey.size(), 0U);

    // scriptPubKey that ends beyond the end of the stream
    DataStream ss4{"000007"_hex};
    try {
        Coin cc4;
        ss4 >> cc4;
        BOOST_CHECK_MESSAGE(false, "We should have thrown");
    } catch (const std::ios_base::failure&) {
    }

    // Very large scriptPubKey (3*10^9 bytes) past the end of the stream
    DataStream tmp{};
    uint64_t x = 3000000000ULL;
    tmp << VARINT(x);
    BOOST_CHECK_EQUAL(HexStr(tmp), "8a95c0bb00");
    DataStream ss5{"00008a95c0bb00"_hex};
    try {
        Coin cc5;
        ss5 >> cc5;
        BOOST_CHECK_MESSAGE(false, "We should have thrown");
    } catch (const std::ios_base::failure&) {
    }
}